

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_int<__int128,fmt::v6::basic_format_specs<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,__int128 value,
          basic_format_specs<wchar_t> *spec)

{
  char spec_00;
  long in_RCX;
  __int128 in_stack_ffffffffffffffb8;
  
  spec_00 = *(char *)(in_RCX + 8);
  basic_writer<fmt::v6::buffer_range<wchar_t>_>::
  int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::int_writer
            ((int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *)&stack0xffffffffffffffb8
             ,(basic_writer<fmt::v6::buffer_range<wchar_t>_> *)this,in_stack_ffffffffffffffb8,spec);
  handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>>
            (spec_00,(int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *)
                     &stack0xffffffffffffffb8);
  return;
}

Assistant:

void write_int(T value, const Spec& spec) {
    handle_int_type_spec(spec.type, int_writer<T, Spec>(*this, value, spec));
  }